

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsCopyStringUtf16(JsValueRef value,int start,int length,uint16_t *buffer,size_t *written)

{
  anon_class_8_1_4eff857e local_38;
  size_t *local_30;
  size_t *written_local;
  uint16_t *buffer_local;
  int length_local;
  int start_local;
  JsValueRef value_local;
  
  if (value == (JsValueRef)0x0) {
    value_local._4_4_ = JsErrorNullArgument;
  }
  else if (value == (JsValueRef)0x0) {
    value_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    local_38.buffer = buffer;
    local_30 = written;
    written_local = (size_t *)buffer;
    buffer_local._0_4_ = length;
    buffer_local._4_4_ = start;
    _length_local = value;
    value_local._4_4_ =
         WriteStringCopy<JsCopyStringUtf16::__0>(value,start,length,written,&local_38);
  }
  return value_local._4_4_;
}

Assistant:

CHAKRA_API JsCopyStringUtf16(
    _In_ JsValueRef value,
    _In_ int start,
    _In_ int length,
    _Out_opt_ uint16_t* buffer,
    _Out_opt_ size_t* written)
{
    PARAM_NOT_NULL(value);
    VALIDATE_JSREF(value);

    return WriteStringCopy(value, start, length, written,
        [buffer](const char16* src, size_t count, size_t *needed)
        {
            if (buffer)
            {
                memmove(buffer, src, sizeof(char16) * count);
            }
            return JsNoError;
        });
}